

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectivePosition::exec(CDirectivePosition *this)

{
  CDirectivePosition *this_local;
  
  if (this->type == Physical) {
    FileManager::seekPhysical(g_fileManager,(ulong)(uint)this->position);
  }
  else if (this->type == Virtual) {
    FileManager::seekVirtual(g_fileManager,(ulong)(uint)this->position);
  }
  return;
}

Assistant:

void CDirectivePosition::exec()
{
	switch (type)
	{
	case Physical:
		g_fileManager->seekPhysical((u32)position);
		break;
	case Virtual:
		g_fileManager->seekVirtual((u32)position);
		break;
	}
}